

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

void __thiscall
chrono::ChFrameMoving<double>::ChFrameMoving(ChFrameMoving<double> *this,ChFrame<double> *mc)

{
  ChQuaternion<double> *other;
  undefined1 auVar1 [16];
  ChQuaternion<double> local_38;
  
  ChFrame<double>::ChFrame(&this->super_ChFrame<double>,mc);
  auVar1 = ZEXT816(0) << 0x40;
  (this->super_ChFrame<double>)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00121c10;
  (this->coord_dt).pos.m_data[0] = 0.0;
  (this->coord_dt).pos.m_data[1] = 0.0;
  (this->coord_dt).pos.m_data[2] = 0.0;
  (this->coord_dt).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->coord_dt).rot.m_data + 1) = ZEXT1632(auVar1);
  *(undefined1 (*) [32])((this->coord_dt).rot.m_data + 3) = ZEXT1632(auVar1);
  (this->coord_dtdt).rot.m_data[0] = 1.0;
  (this->coord_dtdt).rot.m_data[3] = 0.0;
  (this->coord_dtdt).rot.m_data[1] = 0.0;
  (this->coord_dtdt).rot.m_data[2] = 0.0;
  local_38.m_data = (double  [4])ZEXT1632(auVar1);
  other = ChQuaternion<double>::operator=(&(this->coord_dtdt).rot,&local_38);
  ChQuaternion<double>::operator=(&(this->coord_dt).rot,other);
  return;
}

Assistant:

explicit ChFrameMoving(const ChFrame<Real>& mc) : ChFrame<Real>(mc) {
        coord_dt.rot = coord_dtdt.rot = ChQuaternion<Real>(0, 0, 0, 0);
    }